

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

uint32_t anon_unknown.dwarf_4f6::polymod
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *values)

{
  bool bVar1;
  byte bVar2;
  byte *pbVar3;
  uint8_t top;
  const_iterator cStack_30;
  uchar value;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  uint32_t chk;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *values_local;
  
  __range1._4_4_ = 1;
  __end1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(values);
  cStack_30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end1);
    bVar2 = (byte)(__range1._4_4_ >> 0x19);
    __range1._4_4_ =
         (__range1._4_4_ & 0x1ffffff) << 5 ^ (uint)*pbVar3 ^ -(bVar2 & 1) & 0x3b6a57b2 ^
         -((int)(uint)bVar2 >> 1 & 1U) & 0x26508e6d ^ -((int)(uint)bVar2 >> 2 & 1U) & 0x1ea119fa ^
         -((int)(uint)bVar2 >> 3 & 1U) & 0x3d4233dd ^ -((int)(uint)bVar2 >> 4) & 0x2a1462b3U;
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

uint32_t polymod(const std::vector<unsigned char> &values) {
        uint32_t chk = 1;
        for (unsigned char value : values) {
            auto top = static_cast<uint8_t>(chk >> 25u);
            chk = static_cast<uint32_t>(
                    (chk & 0x1ffffffu) << 5u ^ value ^
                    (-((top >> 0) & 1u) & 0x3b6a57b2UL) ^
                    (-((top >> 1) & 1u) & 0x26508e6dUL) ^
                    (-((top >> 2) & 1u) & 0x1ea119faUL) ^
                    (-((top >> 3) & 1u) & 0x3d4233ddUL) ^
                    (-((top >> 4) & 1u) & 0x2a1462b3UL));
        }
        return chk;
    }